

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O1

REF_STATUS ref_sort_heap_glob(REF_INT n,REF_GLOB *original,REF_INT *sorted_index)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  REF_GLOB RVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  if (0 < n) {
    uVar3 = 0;
    do {
      sorted_index[uVar3] = (REF_INT)uVar3;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  if (n < 2) {
    return 0;
  }
  uVar4 = n - 1;
  uVar3 = (ulong)(((uint)n >> 1) + 1);
  do {
    if ((int)uVar3 < 2) {
      iVar2 = sorted_index[uVar4];
      RVar5 = original[iVar2];
      sorted_index[uVar4] = *sorted_index;
      uVar1 = 1;
      uVar4 = uVar4 - 1;
      if (uVar4 == 0) {
        *sorted_index = iVar2;
        return 0;
      }
    }
    else {
      uVar1 = (ulong)((int)uVar3 - 1);
      iVar2 = sorted_index[uVar3 - 2];
      RVar5 = original[iVar2];
    }
    iVar6 = (int)uVar1 + -1;
    iVar7 = (int)uVar1 * 2 + -1;
    if (iVar7 <= (int)uVar4) {
      do {
        iVar8 = iVar7;
        if ((iVar7 < (int)uVar4) &&
           (original[sorted_index[iVar7]] < original[sorted_index[(long)iVar7 + 1]])) {
          iVar8 = iVar7 + 1;
        }
        if (original[sorted_index[iVar8]] <= RVar5) break;
        sorted_index[iVar6] = sorted_index[iVar8];
        iVar7 = iVar8 * 2 + 1;
        iVar6 = iVar8;
      } while (iVar8 * 2 < (int)uVar4);
    }
    sorted_index[iVar6] = iVar2;
    uVar3 = uVar1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_sort_heap_glob(REF_INT n, REF_GLOB *original,
                                      REF_INT *sorted_index) {
  REF_GLOB q;
  REF_INT i, j, l, ir, indxt;

  for (i = 0; i < n; i++) sorted_index[i] = i;

  if (n < 2) return REF_SUCCESS;

  l = (n >> 1) + 1;
  ir = n - 1;
  for (;;) {
    if (l > 1) {
      l--;
      indxt = sorted_index[l - 1];
      q = original[indxt];
    } else {
      indxt = sorted_index[ir];
      q = original[indxt];
      sorted_index[ir] = sorted_index[0];
      if (--ir == 0) {
        sorted_index[0] = indxt;
        break;
      }
    }
    i = l - 1;
    j = l + i;

    while (j <= ir) {
      if (j < ir) {
        if (original[sorted_index[j]] < original[sorted_index[j + 1]]) j++;
      }
      if (q < original[sorted_index[j]]) {
        sorted_index[i] = sorted_index[j];
        i = j;

        j++;
        j <<= 1;
        j--;

      } else
        break;
    }
    sorted_index[i] = indxt;
  }

  return REF_SUCCESS;
}